

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListLeaf::remove
          (SListLeaf *this,char *__filename)

{
  int extraout_EAX;
  SelectedSummand *in_stack_ffffffffffffff68;
  LDSkipList *this_00;
  Rhs *in_stack_ffffffffffffff98;
  SkipList<Inferences::ALASCA::FourierMotzkinConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::LDComparator>
  *in_stack_ffffffffffffffa0;
  
  this_00 = &this->_children;
  Kernel::SelectedSummand::SelectedSummand((SelectedSummand *)this_00,in_stack_ffffffffffffff68);
  Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs((Rhs *)this_00,in_stack_ffffffffffffff68);
  Lib::
  SkipList<Inferences::ALASCA::FourierMotzkinConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::LDComparator>
  ::remove<Inferences::ALASCA::FourierMotzkinConf::Rhs>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x407f13);
  Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x407f1d);
  return extraout_EAX;
}

Assistant:

void remove(LeafData ld) override { _children.remove(ld); }